

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

TemporaryFileHandle * __thiscall
duckdb::TemporaryFileMap::CreateFile(TemporaryFileMap *this,TemporaryFileIdentifier *identifier)

{
  TemporaryFileManager *manager;
  idx_t temp_file_count;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TemporaryFileHandle,std::default_delete<duckdb::TemporaryFileHandle>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TemporaryFileHandle,std::default_delete<duckdb::TemporaryFileHandle>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var1;
  TemporaryFileHandle *this_00;
  type pTVar2;
  pointer *__ptr;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>,_false,_false>,_bool>
  pVar3;
  TemporaryFileHandle *local_38;
  TemporaryBufferSize local_30;
  
  local_30 = identifier->size;
  p_Var1 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TemporaryFileHandle,std::default_delete<duckdb::TemporaryFileHandle>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TemporaryFileHandle,std::default_delete<duckdb::TemporaryFileHandle>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            *)::std::__detail::
              _Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->files,&local_30);
  local_30 = optional_idx::GetIndex(&identifier->file_index);
  manager = this->manager;
  temp_file_count = *(idx_t *)(p_Var1 + 0x18);
  this_00 = (TemporaryFileHandle *)operator_new(0xe0);
  TemporaryFileHandle::TemporaryFileHandle(this_00,manager,*identifier,temp_file_count);
  local_38 = this_00;
  pVar3 = ::std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TemporaryFileHandle,std::default_delete<duckdb::TemporaryFileHandle>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TemporaryFileHandle,std::default_delete<duckdb::TemporaryFileHandle>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<unsigned_long,duckdb::unique_ptr<duckdb::TemporaryFileHandle,std::default_delete<duckdb::TemporaryFileHandle>,true>>
                    (p_Var1,&local_30);
  if (local_38 != (TemporaryFileHandle *)0x0) {
    ::std::default_delete<duckdb::TemporaryFileHandle>::operator()
              ((default_delete<duckdb::TemporaryFileHandle> *)&local_38,local_38);
  }
  pTVar2 = unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>
           ::operator*((unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>
                        *)((long)pVar3.first.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>,_false>
                                 ._M_cur.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>,_false>
                          + 0x10));
  return pTVar2;
}

Assistant:

TemporaryFileHandle &TemporaryFileMap::CreateFile(const TemporaryFileIdentifier &identifier) {
	D_ASSERT(identifier.IsValid());
	D_ASSERT(!GetFile(identifier));
	auto &map = GetMapForSize(identifier.size);
	const auto res =
	    map.emplace(identifier.file_index.GetIndex(), make_uniq<TemporaryFileHandle>(manager, identifier, map.size()));
	D_ASSERT(res.second);
	return *res.first->second;
}